

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O2

int __thiscall
Arcflow::min_slack(Arcflow *this,vector<int,_std::allocator<int>_> *b,int i0,int d,
                  vector<int,_std::allocator<int>_> *caps)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  vector<int,_std::allocator<int>_> *pvVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  size_type sVar9;
  int k;
  int iVar10;
  long lVar11;
  reference rVar12;
  int v;
  vector<int,_std::allocator<int>_> *local_a8;
  vector<int,_std::allocator<int>_> *local_a0;
  vector<int,_std::allocator<int>_> Q;
  vector<bool,_std::allocator<bool>_> vis;
  
  iVar1 = (caps->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish[-1];
  if ((long)iVar1 == 0) {
    iVar7 = 0;
  }
  else {
    Q.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    Q.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    Q.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_a0 = b;
    std::vector<bool,_std::allocator<bool>_>::vector(&vis,(long)iVar1 + 1,(allocator_type *)&v);
    rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[](&vis,0);
    *rVar12._M_p = *rVar12._M_p | rVar12._M_mask;
    v = 0;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&Q,&v);
    local_a8 = (vector<int,_std::allocator<int>_> *)(long)d;
    iVar6 = 0;
    for (lVar8 = (long)i0; lVar8 < (this->inst).nsizes; lVar8 = lVar8 + 1) {
      lVar11 = *(long *)&(this->weights).
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar8].
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data;
      if (*(int *)(lVar11 + (long)local_a8 * 4) != 0) {
        uVar3 = (ulong)((long)Q.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)Q.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2;
        iVar7 = (int)uVar3;
        uVar4 = 0;
        if (0 < iVar7) {
          uVar4 = uVar3 & 0xffffffff;
        }
        for (uVar3 = 0; uVar3 != uVar4; uVar3 = uVar3 + 1) {
          v = Q.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar3];
          for (iVar10 = 1;
              iVar10 <= (local_a0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start[lVar8]; iVar10 = iVar10 + 1) {
            sVar9 = (long)v + (long)*(int *)(lVar11 + (long)local_a8 * 4);
            v = (int)sVar9;
            if (iVar1 < v) break;
            if (v == iVar1) {
              iVar7 = 0;
              goto LAB_00109c12;
            }
            rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[](&vis,sVar9);
            iVar2 = v;
            if ((*rVar12._M_p & rVar12._M_mask) != 0) break;
            std::vector<int,_std::allocator<int>_>::push_back(&Q,&v);
            if (iVar6 <= iVar2) {
              iVar6 = iVar2;
            }
          }
        }
        for (lVar11 = (long)iVar7;
            lVar11 < (int)((ulong)((long)Q.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_finish -
                                  (long)Q.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start) >> 2); lVar11 = lVar11 + 1
            ) {
          rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             (&vis,(long)Q.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start[lVar11]);
          *rVar12._M_p = *rVar12._M_p | rVar12._M_mask;
        }
      }
    }
    pvVar5 = (vector<int,_std::allocator<int>_> *)
             (caps->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    iVar10 = *(int *)&(pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start;
    iVar7 = iVar10 - iVar6;
    if (iVar10 < iVar6) {
      iVar7 = iVar1 - iVar6;
      local_a0 = (vector<int,_std::allocator<int>_> *)
                 (caps->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      while (pvVar5 != local_a0) {
        lVar8 = (long)*(int *)&(pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start;
        lVar11 = 0;
        local_a8 = pvVar5;
        while( true ) {
          sVar9 = lVar8 + lVar11;
          rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[](&vis,sVar9);
          if (((*rVar12._M_p & rVar12._M_mask) != 0) || ((long)sVar9 < lVar8 - iVar7)) break;
          lVar11 = lVar11 + -1;
        }
        iVar1 = -(int)lVar11;
        if (iVar7 <= -(int)lVar11) {
          iVar1 = iVar7;
        }
        iVar7 = iVar1;
        pvVar5 = (vector<int,_std::allocator<int>_> *)
                 ((long)&(local_a8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start + 4);
      }
    }
LAB_00109c12:
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              (&vis.super__Bvector_base<std::allocator<bool>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&Q.super__Vector_base<int,_std::allocator<int>_>);
  }
  return iVar7;
}

Assistant:

int Arcflow::min_slack(const std::vector<int> &b, int i0, int d,
					   const std::vector<int> &caps) const {
	int C = caps.back();
	if (C == 0) {
		return 0;
	}
	std::vector<int> Q;
	std::vector<bool> vis(C + 1);
	vis[0] = true;
	Q.push_back(0);
	int res = 0;
	for (int i = i0; i < inst.nsizes; i++) {
		const int &w = weights[i][d];
		if (!w) {
			continue;
		}
		int qs = Q.size();
		for (int j = 0; j < qs; j++) {
			int u = Q[j];
			int v = u;
			for (int k = 1; k <= b[i]; k++) {
				v += w;
				if (v > C) {
					break;
				} else if (v == C) {
					return 0;
				} else if (vis[v]) {
					break;
				}
				res = std::max(res, v);
				Q.push_back(v);
			}
		}
		for (int j = qs; j < static_cast<int>(Q.size()); j++) {
			vis[Q[j]] = true;
		}
	}
	if (res <= caps[0]) {
		return caps[0] - res;
	} else {
		int mslack = C - res;
		for (int cap : caps) {
			int p = cap;
			while (!vis[p] && cap - p <= mslack) {
				p--;
			}
			mslack = std::min(mslack, cap - p);
		}
		return mslack;
	}
}